

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  SQL sql;
  allocator aStack_7f299;
  string sStack_7f298;
  SQL SStack_7f278;
  
  SQL::SQL(&SStack_7f278);
  if (1 < argc) {
    std::__cxx11::string::string((string *)&sStack_7f298,argv[1],&aStack_7f299);
    SQL::execute_file(&SStack_7f278,&sStack_7f298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_7f298._M_dataplus._M_p != &sStack_7f298.field_2) {
      operator_delete(sStack_7f298._M_dataplus._M_p);
    }
  }
  SQL::interactive(&SStack_7f278);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  system("pause");
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
  ::~BPlusTree(&SStack_7f278.tables.tree);
  BPlusTree<int>::~BPlusTree(&SStack_7f278.parser.sql_state.quote_states);
  BPlusTree<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~BPlusTree(&SStack_7f278.parser.sql_state.parse_states.tree);
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
  ::~BPlusTree((BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
                *)&SStack_7f278.parser.sql_state);
  LinkedList::delete_all<string_tokenizer::Token>
            ((Node<string_tokenizer::Token> **)&SStack_7f278.parser);
  return 0;
}

Assistant:

int main(int argc, char const* argv[]) {
    SQL sql;
    if (argc > 1) {
        sql.execute_file(argv[1]);
    }
    sql.interactive();
    
    cout << endl;
    system("pause");
    return 0;
}